

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

void __thiscall indigox::Molecule::RemoveAtom(Molecule *this,Atom_p *a)

{
  bool bVar1;
  AtomBondIterator b;
  element_type *__x;
  Atom *pAVar2;
  long in_RDI;
  Bond_p tmp;
  AtomBondIterator bs;
  Atom_p hit;
  __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  it;
  Atom *in_stack_fffffffffffffe88;
  map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  *in_stack_fffffffffffffe90;
  Atom *in_stack_fffffffffffffe98;
  __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  in_stack_fffffffffffffea0;
  const_iterator in_stack_fffffffffffffea8;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffeb0;
  Bond *in_stack_fffffffffffffec0;
  undefined1 local_e0 [96];
  weak_ptr<indigox::Bond> *local_80;
  __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
  local_78;
  iterator local_60;
  iterator local_58;
  iterator local_50;
  __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  local_48;
  
  std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x111b1e);
  Atom::GetMolecule(in_stack_fffffffffffffe98);
  std::enable_shared_from_this<indigox::Molecule>::shared_from_this
            ((enable_shared_from_this<indigox::Molecule> *)in_stack_fffffffffffffe88);
  bVar1 = std::operator!=((shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffe90,
                          (shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffe88);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x111b6f);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x111b7c);
  if (!bVar1) {
    local_50 = std::
               vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ::begin((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                        *)in_stack_fffffffffffffe88);
    local_58 = std::
               vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ::end((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      *)in_stack_fffffffffffffe88);
    local_48 = std::
               find<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Atom>*,std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>>,std::shared_ptr<indigox::Atom>>
                         ((__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                           )in_stack_fffffffffffffea8._M_current,in_stack_fffffffffffffea0,
                          (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffe98);
    local_60 = std::
               vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ::end((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      *)in_stack_fffffffffffffe88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
      ::operator*(&stack0xffffffffffffffb8);
      pAVar2 = (Atom *)&stack0xffffffffffffff90;
      std::shared_ptr<indigox::Atom>::shared_ptr
                ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffe90,
                 (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffe88);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x111c68);
      local_78._M_current = (weak_ptr<indigox::Bond> *)Atom::BeginBond(in_stack_fffffffffffffe88);
      while( true ) {
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x111c91);
        b = Atom::EndBond(in_stack_fffffffffffffe88);
        local_80 = (weak_ptr<indigox::Bond> *)b;
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                            *)in_stack_fffffffffffffe90,
                           (__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                            *)in_stack_fffffffffffffe88);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
        ::operator->(&local_78);
        std::weak_ptr<indigox::Bond>::lock((weak_ptr<indigox::Bond> *)in_stack_fffffffffffffe98);
        std::
        map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
        ::erase(in_stack_fffffffffffffe90,(key_type *)in_stack_fffffffffffffe88);
        std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x111d15);
        Bond::GetSourceAtom((Bond *)in_stack_fffffffffffffe98);
        bVar1 = std::operator!=((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffe90,
                                (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffe88);
        std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111d4d);
        if (bVar1) {
          std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x111d67);
          Bond::GetSourceAtom((Bond *)in_stack_fffffffffffffe98);
          std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x111d86);
          in_stack_fffffffffffffec0 = (Bond *)(local_e0 + 0x20);
          std::shared_ptr<indigox::Bond>::shared_ptr
                    ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffe90,
                     (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffe88);
          Atom::RemoveBond(pAVar2,(Bond_p *)b._M_current);
          std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x111dc3);
          std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111dd0);
        }
        else {
          std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x111e47);
          Bond::GetTargetAtom((Bond *)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffea8._M_current =
               (shared_ptr<indigox::Atom> *)
               std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x111e66);
          in_stack_fffffffffffffeb0 =
               (Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *
               )local_e0;
          std::shared_ptr<indigox::Bond>::shared_ptr
                    ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffe90,
                     (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffe88);
          Atom::RemoveBond(pAVar2,(Bond_p *)b._M_current);
          std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x111ea3);
          std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111eb0);
        }
        std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x111eef);
        Bond::Clear(in_stack_fffffffffffffec0);
        std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x111f06);
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
        ::operator++(&local_78);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Atom>const*,std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>>
      ::__normal_iterator<std::shared_ptr<indigox::Atom>*>
                ((__normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                  *)in_stack_fffffffffffffe90,
                 (__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                  *)in_stack_fffffffffffffe88);
      std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
      ::erase((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               *)in_stack_fffffffffffffea0._M_current,in_stack_fffffffffffffea8);
      __x = std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x111f8a);
      pAVar2 = (Atom *)std::
                       map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                       ::at((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                             *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8._M_current);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      RemoveVertex(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8._M_current);
      std::
      map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
      ::erase((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
               *)pAVar2,(key_type *)__x);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x111fef);
      Atom::Clear(pAVar2);
      *(undefined1 *)(in_RDI + 0x158) = 1;
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x112015);
    }
  }
  return;
}

Assistant:

void Molecule::RemoveAtom(Atom_p a) {
  if (a->GetMolecule() != shared_from_this()) return;
  auto it = std::find(atoms_.begin(), atoms_.end(), a);
  if (it != atoms_.end()) {
    Atom_p hit = *it;
    for (AtomBondIterator bs = hit->BeginBond(); bs != hit->EndBond(); ++bs) {
      Bond_p tmp = bs->lock();
      bond_to_edge_.erase(tmp);
      if (tmp->GetSourceAtom() != hit) tmp->GetSourceAtom()->RemoveBond(tmp);
      else tmp->GetTargetAtom()->RemoveBond(tmp);
      tmp->Clear();
    }
    atoms_.erase(it);
    graph_->RemoveVertex(atom_to_vertex_.at(hit));
    atom_to_vertex_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}